

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O2

QString * __thiscall
QAccessibleWidget::text(QString *__return_storage_ptr__,QAccessibleWidget *this,Text t)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  QWidget *pQVar4;
  QWindow *pQVar5;
  long *plVar6;
  QTypedArrayData<char16_t> *tmp;
  char16_t *tmp_1;
  QArrayDataPointer<char16_t> *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  switch(t) {
  case Name:
    if ((this->d->name).d.size != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QString::operator=(__return_storage_ptr__,(QString *)&this->d->name);
        return __return_storage_ptr__;
      }
      goto LAB_004cf9a1;
    }
    pQVar4 = widget(this);
    QWidget::accessibleName((QString *)&local_58,pQVar4);
    qVar3 = local_58.size;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    if (qVar3 == 0) {
      pQVar4 = widget(this);
      if (((pQVar4->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
        pQVar4 = widget(this);
        buddyString((QString *)&local_70,pQVar4);
        qt_accStripAmp((QString *)&local_58,(QString *)&local_70);
        goto LAB_004cf84f;
      }
      pQVar4 = widget(this);
      pQVar5 = QWidget::windowHandle(pQVar4);
      if ((pQVar5 == (QWindow *)0x0) || (plVar6 = (long *)QWindow::handle(), plVar6 == (long *)0x0))
      goto switchD_004cf75e_caseD_2;
      (**(code **)(*plVar6 + 0x80))(&local_58,plVar6);
    }
    else {
      pQVar4 = widget(this);
      QWidget::accessibleName((QString *)&local_58,pQVar4);
    }
    break;
  case Description:
    pQVar4 = widget(this);
    QWidget::accessibleDescription((QString *)&local_58,pQVar4);
    qVar3 = local_58.size;
    pcVar2 = local_58.ptr;
    pDVar1 = local_58.d;
    local_58.d = (Data *)0x0;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = local_58.ptr;
    local_58.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = local_58.size;
    local_58.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    if (qVar3 != 0) goto switchD_004cf75e_caseD_2;
    pQVar4 = widget(this);
    QWidget::toolTip((QString *)&local_58,pQVar4);
    (__return_storage_ptr__->d).d = local_58.d;
    (__return_storage_ptr__->d).ptr = local_58.ptr;
    local_58.d = pDVar1;
    local_58.ptr = pcVar2;
    goto LAB_004cf89e;
  default:
    goto switchD_004cf75e_caseD_2;
  case Help:
    pQVar4 = widget(this);
    QWidget::whatsThis((QString *)&local_58,pQVar4);
    break;
  case Accelerator:
    pQVar4 = widget(this);
    buddyString((QString *)&local_70,pQVar4);
    qt_accHotKey((QString *)&local_58,(QString *)&local_70);
LAB_004cf84f:
    pDVar1 = local_58.d;
    this_00 = &local_70;
    local_58.d = (Data *)0x0;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = local_58.ptr;
    local_58.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = local_58.size;
    local_58.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    goto LAB_004cf8ab;
  case Identifier:
    pQVar4 = widget(this);
    QWidget::accessibleIdentifier((QString *)&local_58,pQVar4);
  }
  pDVar1 = local_58.d;
  local_58.d = (Data *)0x0;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = local_58.ptr;
  local_58.ptr = (char16_t *)0x0;
LAB_004cf89e:
  this_00 = &local_58;
  (__return_storage_ptr__->d).size = local_58.size;
  local_58.size = 0;
LAB_004cf8ab:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
switchD_004cf75e_caseD_2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_004cf9a1:
  __stack_chk_fail();
}

Assistant:

QString QAccessibleWidget::text(QAccessible::Text t) const
{
    QString str;

    switch (t) {
    case QAccessible::Name:
        if (!d->name.isEmpty()) {
            str = d->name;
        } else if (!widget()->accessibleName().isEmpty()) {
            str = widget()->accessibleName();
        } else if (widget()->isWindow()) {
            if (QWindow *window = widget()->windowHandle()) {
                if (QPlatformWindow *platformWindow = window->handle())
                    str = platformWindow->windowTitle();
            }
        } else {
            str = qt_accStripAmp(buddyString(widget()));
        }
        break;
    case QAccessible::Description:
        str = widget()->accessibleDescription();
#if QT_CONFIG(tooltip)
        if (str.isEmpty())
            str = widget()->toolTip();
#endif
        break;
    case QAccessible::Identifier:
        str = widget()->accessibleIdentifier();
        break;
    case QAccessible::Help:
#if QT_CONFIG(whatsthis)
        str = widget()->whatsThis();
#endif
        break;
    case QAccessible::Accelerator:
        str = qt_accHotKey(buddyString(widget()));
        break;
    case QAccessible::Value:
        break;
    default:
        break;
    }
    return str;
}